

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O3

void __thiscall irr::gui::CGUITabControl::clear(CGUITabControl *this)

{
  int *piVar1;
  IGUITab *pIVar2;
  long lVar3;
  pointer ppIVar4;
  long *plVar5;
  pointer ppIVar6;
  ulong uVar7;
  
  ppIVar6 = (this->Tabs).m_data.
            super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->Tabs).m_data.
                          super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar6) >> 3) != 0) {
    uVar7 = 0;
    do {
      if (&ppIVar6[uVar7]->super_IGUIElement != (IGUIElement *)0x0) {
        IGUIElement::removeChild((IGUIElement *)this,&ppIVar6[uVar7]->super_IGUIElement);
        ppIVar6 = (this->Tabs).m_data.
                  super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pIVar2 = ppIVar6[uVar7];
        lVar3 = *(long *)(*(long *)&(pIVar2->super_IGUIElement).super_IEventReceiver + -0x18);
        piVar1 = (int *)((long)&(pIVar2->super_IGUIElement).Children + lVar3 + 8U);
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          plVar5 = (long *)((long)&(pIVar2->super_IGUIElement).super_IEventReceiver + lVar3);
          (**(code **)(*plVar5 + 8))(plVar5);
          ppIVar6 = (this->Tabs).m_data.
                    super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < ((ulong)((long)(this->Tabs).m_data.
                                    super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar6) >> 3
                     & 0xffffffff));
  }
  ppIVar4 = (this->Tabs).m_data.
            super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (this->Tabs).m_data.super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Tabs).m_data.super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Tabs).m_data.super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppIVar6 != (pointer)0x0) {
    operator_delete(ppIVar6,(long)ppIVar4 - (long)ppIVar6);
  }
  (this->Tabs).is_sorted = true;
  recalculateScrollBar(this);
  return;
}

Assistant:

void CGUITabControl::clear()
{
	for (u32 i = 0; i < Tabs.size(); ++i) {
		if (Tabs[i]) {
			IGUIElement::removeChild(Tabs[i]);
			Tabs[i]->drop();
		}
	}
	Tabs.clear();

	recalculateScrollBar();
}